

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O0

size_t qHash(longdouble key,size_t seed)

{
  long lVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  undefined6 in_stack_0000001a;
  void *in_stack_00000020;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = murmurhash(in_stack_00000020,CONCAT62(in_stack_0000001a,key._8_2_),SUB108(key,0));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

size_t qHash(long double key, size_t seed) noexcept
{
    // ensure -0 gets mapped to 0
    key += static_cast<long double>(0.0);
    if constexpr (sizeof(long double) == sizeof(size_t)) {
        size_t k;
        memcpy(&k, &key, sizeof(long double));
        return QHashPrivate::hash(k, seed);
    } else {
        return murmurhash(&key, sizeof(key), seed);
    }
}